

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O0

TableFunction *
duckdb::FunctionSerializer::
DeserializeFunction<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
          (ClientContext *context,CatalogType catalog_type,string *name,
          vector<duckdb::LogicalType,_true> *arguments,
          vector<duckdb::LogicalType,_true> *original_arguments)

{
  bool bVar1;
  CatalogEntry *pCVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  CatalogType in_DL;
  string *in_RSI;
  TableFunction *in_RDI;
  vector<duckdb::LogicalType,_true> *in_R8;
  vector<duckdb::LogicalType,_true> *in_R9;
  vector<duckdb::LogicalType,_true> *in_stack_00000008;
  ClientContext *in_stack_00000010;
  TableFunctionSet *in_stack_00000018;
  TableFunctionCatalogEntry *functions;
  CatalogEntry *func_catalog;
  EntryLookupInfo lookup_info;
  TableFunction *function;
  EntryLookupInfo *in_stack_fffffffffffffe58;
  CatalogEntry *in_stack_fffffffffffffe60;
  EntryLookupInfo *in_stack_fffffffffffffe68;
  optional_idx in_stack_fffffffffffffe70;
  string *msg;
  allocator *this;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  CatalogEntry *local_68;
  optional_idx local_60;
  QueryErrorContext local_58 [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  CatalogType local_11;
  string *local_10;
  
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  optional_idx::optional_idx(&local_60);
  QueryErrorContext::QueryErrorContext(local_58,local_60);
  EntryLookupInfo::EntryLookupInfo
            (in_stack_fffffffffffffe68,(CatalogType)((ulong)in_stack_fffffffffffffe60 >> 0x38),
             (string *)in_stack_fffffffffffffe58,(QueryErrorContext)in_stack_fffffffffffffe70.index)
  ;
  this = &local_89;
  msg = local_10;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_88,"system",this);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_c0,"main",&local_c1);
  pCVar2 = Catalog::GetEntry((ClientContext *)in_stack_fffffffffffffe70.index,
                             (string *)in_stack_fffffffffffffe68,(string *)in_stack_fffffffffffffe60
                             ,in_stack_fffffffffffffe58);
  ::std::__cxx11::string::~string(local_c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  ::std::__cxx11::string::~string(local_88);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_68 = pCVar2;
  if (pCVar2->type != local_11) {
    uVar3 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_e8,"DeserializeFunction - cant find catalog entry for function %s",&local_e9);
    ::std::__cxx11::string::string(local_110,(string *)local_20);
    InternalException::InternalException<std::__cxx11::string>((InternalException *)this,msg,in_RCX)
    ;
    __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
  }
  CatalogEntry::Cast<duckdb::TableFunctionCatalogEntry>(in_stack_fffffffffffffe60);
  bVar1 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::empty
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_10);
  if (!bVar1) {
    in_R8 = in_R9;
  }
  TableFunctionSet::GetFunctionByArguments(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  vector<duckdb::LogicalType,_true>::operator=
            (in_R8,(vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe58);
  vector<duckdb::LogicalType,_true>::operator=
            (in_R8,(vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe58);
  return in_RDI;
}

Assistant:

static FUNC DeserializeFunction(ClientContext &context, CatalogType catalog_type, const string &name,
	                                vector<LogicalType> arguments, vector<LogicalType> original_arguments) {
		EntryLookupInfo lookup_info(catalog_type, name);
		auto &func_catalog = Catalog::GetEntry(context, SYSTEM_CATALOG, DEFAULT_SCHEMA, lookup_info);
		if (func_catalog.type != catalog_type) {
			throw InternalException("DeserializeFunction - cant find catalog entry for function %s", name);
		}
		auto &functions = func_catalog.Cast<CATALOG_ENTRY>();
		auto function = functions.functions.GetFunctionByArguments(
		    context, original_arguments.empty() ? arguments : original_arguments);
		function.arguments = std::move(arguments);
		function.original_arguments = std::move(original_arguments);
		return function;
	}